

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadUnit_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  _Elt_pointer psVar1;
  ushort uVar2;
  Logger *pLVar3;
  _Map_pointer ppsVar4;
  _Elt_pointer psVar5;
  _Elt_pointer psVar6;
  float fVar7;
  uint t;
  chunk_guard cn;
  uint local_1d4;
  long *local_1d0;
  long local_1c0 [2];
  chunk_guard local_1b0;
  undefined1 local_198 [376];
  
  if (1 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"Unit");
    return;
  }
  local_1b0.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  psVar6 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar1 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_1b0.nfo = nfo;
  local_1b0.reader = reader;
  if (psVar6 != psVar1) {
    psVar5 = (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppsVar4 = (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if ((((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          super_ChunkInfo).id == nfo->parent_id) {
        uVar2 = StreamReader<false,_false>::Get<short>(reader);
        local_1d4 = (uint)(short)uVar2;
        if (uVar2 < 8) {
          fVar7 = units[local_1d4];
        }
        else {
          pLVar3 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<unsigned_int>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_198,&local_1d4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_198,
                     " is not a valid value for `Units` attribute in `Unit chunk` ",0x3c);
          std::ostream::_M_insert<unsigned_long>((ulong)local_198);
          std::__cxx11::stringbuf::str();
          Logger::warn(pLVar3,(char *)local_1d0);
          fVar7 = 1.0;
        }
        ((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        unit_scale = fVar7;
        if (uVar2 < 8) goto LAB_004dbfcd;
        goto LAB_004dbf94;
      }
      psVar6 = psVar6 + 1;
      if (psVar6 == psVar5) {
        psVar6 = ppsVar4[1];
        ppsVar4 = ppsVar4 + 1;
        psVar5 = psVar6 + 0x20;
      }
    } while (psVar6 != psVar1);
  }
  pLVar3 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[14]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (char (*) [14])0x6eccde);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," is a child of ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198," which does not exist",0x15);
  std::__cxx11::stringbuf::str();
  Logger::warn(pLVar3,(char *)local_1d0);
LAB_004dbf94:
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
LAB_004dbfcd:
  chunk_guard::~chunk_guard(&local_1b0);
  return;
}

Assistant:

void COBImporter::ReadUnit_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
     if(nfo.version > 1) {
        return UnsupportedChunk_Binary(reader,nfo,"Unit");
    }

     const chunk_guard cn(nfo,reader);

    // parent chunks preceede their childs, so we should have the
    // corresponding chunk already.
    for(std::shared_ptr< Node >& nd : out.nodes) {
        if (nd->id == nfo.parent_id) {
            const unsigned int t=reader.GetI2();
            nd->unit_scale = t>=sizeof(units)/sizeof(units[0])?(
                ASSIMP_LOG_WARN_F(t," is not a valid value for `Units` attribute in `Unit chunk` ", nfo.id)
                ,1.f):units[t];

            return;
        }
    }
    ASSIMP_LOG_WARN_F( "`Unit` chunk ", nfo.id, " is a child of ", nfo.parent_id, " which does not exist");
}